

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O1

void __thiscall rw::TexDictionary::destroy(TexDictionary *this)

{
  LLLink *pLVar1;
  LLLink *pLVar2;
  LLLink *pLVar3;
  
  if (*(TexDictionary **)(engine + 8 + (long)textureModuleOffset) == this) {
    *(undefined8 *)(engine + 8 + (long)textureModuleOffset) = 0;
  }
  pLVar3 = (this->textures).link.next;
  while (pLVar3 != &(this->textures).link) {
    pLVar1 = pLVar3->next;
    pLVar2 = pLVar3->prev;
    pLVar2->next = pLVar1;
    pLVar3->next->prev = pLVar2;
    pLVar3[-1].prev = (LLLink *)0x0;
    Texture::destroy((Texture *)(pLVar3 + -1));
    pLVar3 = pLVar1;
  }
  PluginList::destruct((PluginList *)&s_plglist,this);
  pLVar3 = (this->inGlobalList).prev;
  pLVar3->next = (this->inGlobalList).next;
  ((this->inGlobalList).next)->prev = pLVar3;
  (*DAT_00148850)(this);
  numAllocated = numAllocated + -1;
  return;
}

Assistant:

void
TexDictionary::destroy(void)
{
	if(TEXTUREGLOBAL(currentTexDict) == this)
		TEXTUREGLOBAL(currentTexDict) = nil;
	FORLIST(lnk, this->textures){
		Texture *tex = Texture::fromDict(lnk);
		this->remove(tex);
		tex->destroy();
	}
	s_plglist.destruct(this);
	this->inGlobalList.remove();
	rwFree(this);
	numAllocated--;
}